

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

void __thiscall
pbrt::PixelSensor::PixelSensor
          (PixelSensor *this,SpectrumHandle *r_bar,SpectrumHandle *g_bar,SpectrumHandle *b_bar,
          RGBColorSpace *outputColorSpace,Float wbTemp,Float imagingRatio,Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  PixelSensor *pPVar6;
  undefined1 auVar7 [12];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  DenselySampledSpectrum sensorIlluminant;
  DenselySampledSpectrum local_90;
  SpectrumHandle local_68;
  SpectrumHandle local_60;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> local_58;
  char local_34;
  undefined1 auVar22 [36];
  
  auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  lVar5 = 0;
  pPVar6 = this;
  do {
    auVar10 = vpbroadcastq_avx512f();
    lVar5 = lVar5 + 1;
    uVar1 = vpcmpeqq_avx512f(auVar10,auVar8);
    uVar2 = vpcmpeqq_avx512f(auVar10,auVar9);
    auVar10 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar10 = vpsrld_avx512f(auVar10,0x1f);
    auVar10 = vcvtdq2ps_avx512f(auVar10);
    iVar3 = (pPVar6->r_bar).lambda_min;
    iVar4 = (pPVar6->r_bar).lambda_max;
    auVar7 = auVar10._0_12_;
    uVar11 = (pPVar6->XYZFromSensorRGB).m[1][0];
    auVar22._12_4_ = uVar11;
    auVar22._0_12_ = auVar7;
    uVar12 = (pPVar6->XYZFromSensorRGB).m[1][1];
    auVar22._16_4_ = uVar12;
    uVar13 = (pPVar6->XYZFromSensorRGB).m[1][2];
    auVar22._20_4_ = uVar13;
    uVar14 = (pPVar6->XYZFromSensorRGB).m[2][0];
    auVar22._24_4_ = uVar14;
    uVar15 = (pPVar6->XYZFromSensorRGB).m[2][1];
    auVar22._28_4_ = uVar15;
    uVar16 = (pPVar6->XYZFromSensorRGB).m[2][2];
    auVar22._32_4_ = uVar16;
    uVar17 = *(undefined4 *)&pPVar6->field_0x24;
    auVar10._36_4_ = uVar17;
    auVar10._0_36_ = auVar22;
    uVar18 = iVar3;
    auVar10._40_4_ = uVar18;
    uVar19 = iVar4;
    auVar10._44_4_ = uVar19;
    uVar20 = *(undefined4 *)&(pPVar6->r_bar).values.alloc.memoryResource;
    auVar10._48_4_ = uVar20;
    uVar21 = *(undefined4 *)((long)&(pPVar6->r_bar).values.alloc.memoryResource + 4);
    auVar10._52_4_ = uVar21;
    auVar10._56_4_ = *(undefined4 *)&(pPVar6->r_bar).values.ptr;
    auVar10._60_4_ = *(undefined4 *)((long)&(pPVar6->r_bar).values.ptr + 4);
    pPVar6->XYZFromSensorRGB = (SquareMatrix<3>)auVar22;
    *(undefined4 *)&pPVar6->field_0x24 = *(undefined4 *)&pPVar6->field_0x24;
    (pPVar6->r_bar).lambda_min = iVar3;
    (pPVar6->r_bar).lambda_max = iVar4;
    (pPVar6->r_bar).values.alloc = (polymorphic_allocator<float>)auVar10._48_8_;
    (pPVar6->r_bar).values.ptr = (float *)auVar10._56_8_;
    pPVar6 = (PixelSensor *)((pPVar6->XYZFromSensorRGB).m + 1);
  } while (lVar5 != 3);
  local_90._0_8_ =
       (r_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->r_bar,(SpectrumHandle *)&local_90,0x168,0x33e,alloc);
  local_90._0_8_ =
       (g_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->g_bar,(SpectrumHandle *)&local_90,0x168,0x33e,alloc);
  local_90._0_8_ =
       (b_bar->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->b_bar,(SpectrumHandle *)&local_90,0x168,0x33e,alloc);
  this->imagingRatio = imagingRatio;
  Spectra::D(&local_90,wbTemp,alloc);
  local_60.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&local_90 | 0x2000000000000);
  local_68.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&outputColorSpace->illuminant | 0x2000000000000);
  SolveXYZFromSensorRGB
            ((optional<pbrt::SquareMatrix<3>_> *)&local_58.__align,this,&local_60,&local_68);
  if (local_34 != '\0') {
    (this->XYZFromSensorRGB).m[2][2] = (Float)local_58._32_4_;
    *(undefined8 *)(this->XYZFromSensorRGB).m[0] = local_58._0_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[0] + 2) = local_58._8_8_;
    *(undefined8 *)((this->XYZFromSensorRGB).m[1] + 1) = local_58._16_8_;
    *(undefined8 *)(this->XYZFromSensorRGB).m[2] = local_58._24_8_;
    local_90.values.nStored = 0;
    (*(local_90.values.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_90.values.alloc.memoryResource,local_90.values.ptr,local_90.values.nAlloc << 2,
               4);
    return;
  }
  ErrorExit<>("Sensor XYZ from RGB matrix could not be solved.");
}

Assistant:

PixelSensor(SpectrumHandle r_bar, SpectrumHandle g_bar, SpectrumHandle b_bar,
                const RGBColorSpace *outputColorSpace, Float wbTemp, Float imagingRatio,
                Allocator alloc)
        : r_bar(r_bar, alloc),
          g_bar(g_bar, alloc),
          b_bar(b_bar, alloc),
          imagingRatio(imagingRatio) {
        // Compute XYZ from camera RGB matrix
        DenselySampledSpectrum sensorIlluminant = Spectra::D(wbTemp, alloc);
        pstd::optional<SquareMatrix<3>> m =
            SolveXYZFromSensorRGB(&sensorIlluminant, &outputColorSpace->illuminant);
        if (!m)
            ErrorExit("Sensor XYZ from RGB matrix could not be solved.");
        XYZFromSensorRGB = *m;
    }